

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

char * __thiscall
google::protobuf::DescriptorProto::_InternalParse(DescriptorProto *this,char *ptr,ParseContext *ctx)

{
  ArenaStringPtr *this_00;
  byte bVar1;
  byte bVar2;
  int iVar3;
  Rep *pRVar4;
  DescriptorProto_ExtensionRange *msg;
  string *s;
  DescriptorProto *msg_00;
  EnumDescriptorProto *msg_01;
  OneofDescriptorProto *msg_02;
  FieldDescriptorProto *pFVar5;
  MessageOptions *pMVar6;
  DescriptorProto_ReservedRange *msg_03;
  char cVar7;
  uint32 res;
  uint tag;
  Arena *pAVar8;
  byte *p;
  pair<const_char_*,_unsigned_int> pVar9;
  pair<const_char_*,_bool> pVar10;
  
  this_00 = &this->name_;
  do {
    if (ptr < (ctx->super_EpsCopyInputStream).limit_end_) {
      pVar10._8_8_ = 0;
      pVar10.first = ptr;
    }
    else {
      pVar10._8_8_ = 1;
      pVar10.first = ptr;
      if ((long)ptr - (long)(ctx->super_EpsCopyInputStream).buffer_end_ !=
          (long)(ctx->super_EpsCopyInputStream).limit_) {
        pVar10 = internal::EpsCopyInputStream::DoneFallback
                           (&ctx->super_EpsCopyInputStream,ptr,ctx->group_depth_);
      }
    }
    p = (byte *)pVar10.first;
    if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      return (char *)p;
    }
    bVar1 = *p;
    pVar9.second._0_1_ = bVar1;
    pVar9.first = (char *)(p + 1);
    pVar9._9_7_ = 0;
    if ((char)bVar1 < '\0') {
      bVar2 = p[1];
      res = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
      if ((char)bVar2 < '\0') {
        pVar9 = internal::ReadTagFallback((char *)p,res);
      }
      else {
        pVar9.second = res;
        pVar9.first = (char *)(p + 2);
        pVar9._12_4_ = 0;
      }
    }
    ptr = pVar9.first;
    if (ptr == (char *)0x0) {
LAB_002f6ba4:
      cVar7 = '\x04';
    }
    else {
      tag = pVar9.second;
      cVar7 = (char)pVar9.second;
      switch((uint)(pVar9._8_8_ >> 3) & 0x1fffffff) {
      case 1:
        if (cVar7 != '\n') break;
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
        pAVar8 = (Arena *)(this->_internal_metadata_).
                          super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                          .ptr_;
        if (((ulong)pAVar8 & 1) != 0) {
          pAVar8 = *(Arena **)(((ulong)pAVar8 & 0xfffffffffffffffe) + 0x18);
        }
        if (this_00->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
          internal::ArenaStringPtr::CreateInstance
                    (this_00,pAVar8,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
        }
        ptr = internal::InlineGreedyStringParser(this_00->ptr_,ptr,ctx);
        goto LAB_002f6b87;
      case 2:
        if (cVar7 == '\x12') {
          ptr = ptr + -1;
          do {
            pRVar4 = (this->field_).super_RepeatedPtrFieldBase.rep_;
            if (pRVar4 == (Rep *)0x0) {
LAB_002f68f1:
              internal::RepeatedPtrFieldBase::Reserve
                        (&(this->field_).super_RepeatedPtrFieldBase,
                         (this->field_).super_RepeatedPtrFieldBase.total_size_ + 1);
LAB_002f6901:
              pRVar4 = (this->field_).super_RepeatedPtrFieldBase.rep_;
              pRVar4->allocated_size = pRVar4->allocated_size + 1;
              pFVar5 = Arena::CreateMaybeMessage<google::protobuf::FieldDescriptorProto>
                                 ((this->field_).super_RepeatedPtrFieldBase.arena_);
              pRVar4 = (this->field_).super_RepeatedPtrFieldBase.rep_;
              iVar3 = (this->field_).super_RepeatedPtrFieldBase.current_size_;
              (this->field_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
              pRVar4->elements[iVar3] = pFVar5;
            }
            else {
              iVar3 = (this->field_).super_RepeatedPtrFieldBase.current_size_;
              if (pRVar4->allocated_size <= iVar3) {
                if (pRVar4->allocated_size == (this->field_).super_RepeatedPtrFieldBase.total_size_)
                goto LAB_002f68f1;
                goto LAB_002f6901;
              }
              (this->field_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
              pFVar5 = (FieldDescriptorProto *)pRVar4->elements[iVar3];
            }
            ptr = internal::ParseContext::ParseMessage<google::protobuf::FieldDescriptorProto>
                            (ctx,pFVar5,ptr + 1);
            if (ptr == (char *)0x0) goto LAB_002f6ba4;
            cVar7 = '\x02';
          } while ((ptr < (ctx->super_EpsCopyInputStream).limit_end_) && (*ptr == '\x12'));
          goto LAB_002f6b99;
        }
        break;
      case 3:
        if (cVar7 == '\x1a') {
          ptr = ptr + -1;
          do {
            pRVar4 = (this->nested_type_).super_RepeatedPtrFieldBase.rep_;
            if (pRVar4 == (Rep *)0x0) {
LAB_002f66d5:
              internal::RepeatedPtrFieldBase::Reserve
                        (&(this->nested_type_).super_RepeatedPtrFieldBase,
                         (this->nested_type_).super_RepeatedPtrFieldBase.total_size_ + 1);
LAB_002f66e5:
              pRVar4 = (this->nested_type_).super_RepeatedPtrFieldBase.rep_;
              pRVar4->allocated_size = pRVar4->allocated_size + 1;
              msg_00 = Arena::CreateMaybeMessage<google::protobuf::DescriptorProto>
                                 ((this->nested_type_).super_RepeatedPtrFieldBase.arena_);
              pRVar4 = (this->nested_type_).super_RepeatedPtrFieldBase.rep_;
              iVar3 = (this->nested_type_).super_RepeatedPtrFieldBase.current_size_;
              (this->nested_type_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
              pRVar4->elements[iVar3] = msg_00;
            }
            else {
              iVar3 = (this->nested_type_).super_RepeatedPtrFieldBase.current_size_;
              if (pRVar4->allocated_size <= iVar3) {
                if (pRVar4->allocated_size ==
                    (this->nested_type_).super_RepeatedPtrFieldBase.total_size_) goto LAB_002f66d5;
                goto LAB_002f66e5;
              }
              (this->nested_type_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
              msg_00 = (DescriptorProto *)pRVar4->elements[iVar3];
            }
            ptr = internal::ParseContext::ParseMessage<google::protobuf::DescriptorProto>
                            (ctx,msg_00,ptr + 1);
            if (ptr == (char *)0x0) goto LAB_002f6ba4;
            cVar7 = '\x02';
          } while ((ptr < (ctx->super_EpsCopyInputStream).limit_end_) && (*ptr == '\x1a'));
          goto LAB_002f6b99;
        }
        break;
      case 4:
        if (cVar7 == '\"') {
          ptr = ptr + -1;
          do {
            pRVar4 = (this->enum_type_).super_RepeatedPtrFieldBase.rep_;
            if (pRVar4 == (Rep *)0x0) {
LAB_002f677f:
              internal::RepeatedPtrFieldBase::Reserve
                        (&(this->enum_type_).super_RepeatedPtrFieldBase,
                         (this->enum_type_).super_RepeatedPtrFieldBase.total_size_ + 1);
LAB_002f678f:
              pRVar4 = (this->enum_type_).super_RepeatedPtrFieldBase.rep_;
              pRVar4->allocated_size = pRVar4->allocated_size + 1;
              msg_01 = Arena::CreateMaybeMessage<google::protobuf::EnumDescriptorProto>
                                 ((this->enum_type_).super_RepeatedPtrFieldBase.arena_);
              pRVar4 = (this->enum_type_).super_RepeatedPtrFieldBase.rep_;
              iVar3 = (this->enum_type_).super_RepeatedPtrFieldBase.current_size_;
              (this->enum_type_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
              pRVar4->elements[iVar3] = msg_01;
            }
            else {
              iVar3 = (this->enum_type_).super_RepeatedPtrFieldBase.current_size_;
              if (pRVar4->allocated_size <= iVar3) {
                if (pRVar4->allocated_size ==
                    (this->enum_type_).super_RepeatedPtrFieldBase.total_size_) goto LAB_002f677f;
                goto LAB_002f678f;
              }
              (this->enum_type_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
              msg_01 = (EnumDescriptorProto *)pRVar4->elements[iVar3];
            }
            ptr = internal::ParseContext::ParseMessage<google::protobuf::EnumDescriptorProto>
                            (ctx,msg_01,ptr + 1);
            if (ptr == (char *)0x0) goto LAB_002f6ba4;
            cVar7 = '\x02';
          } while ((ptr < (ctx->super_EpsCopyInputStream).limit_end_) && (*ptr == '\"'));
          goto LAB_002f6b99;
        }
        break;
      case 5:
        if (cVar7 == '*') {
          ptr = ptr + -1;
          do {
            pRVar4 = (this->extension_range_).super_RepeatedPtrFieldBase.rep_;
            if (pRVar4 == (Rep *)0x0) {
LAB_002f6514:
              internal::RepeatedPtrFieldBase::Reserve
                        (&(this->extension_range_).super_RepeatedPtrFieldBase,
                         (this->extension_range_).super_RepeatedPtrFieldBase.total_size_ + 1);
LAB_002f6524:
              pRVar4 = (this->extension_range_).super_RepeatedPtrFieldBase.rep_;
              pRVar4->allocated_size = pRVar4->allocated_size + 1;
              msg = Arena::CreateMaybeMessage<google::protobuf::DescriptorProto_ExtensionRange>
                              ((this->extension_range_).super_RepeatedPtrFieldBase.arena_);
              pRVar4 = (this->extension_range_).super_RepeatedPtrFieldBase.rep_;
              iVar3 = (this->extension_range_).super_RepeatedPtrFieldBase.current_size_;
              (this->extension_range_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
              pRVar4->elements[iVar3] = msg;
            }
            else {
              iVar3 = (this->extension_range_).super_RepeatedPtrFieldBase.current_size_;
              if (pRVar4->allocated_size <= iVar3) {
                if (pRVar4->allocated_size ==
                    (this->extension_range_).super_RepeatedPtrFieldBase.total_size_)
                goto LAB_002f6514;
                goto LAB_002f6524;
              }
              (this->extension_range_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
              msg = (DescriptorProto_ExtensionRange *)pRVar4->elements[iVar3];
            }
            ptr = internal::ParseContext::
                  ParseMessage<google::protobuf::DescriptorProto_ExtensionRange>(ctx,msg,ptr + 1);
            if (ptr == (char *)0x0) goto LAB_002f6ba4;
            cVar7 = '\x02';
          } while ((ptr < (ctx->super_EpsCopyInputStream).limit_end_) && (*ptr == '*'));
          goto LAB_002f6b99;
        }
        break;
      case 6:
        if (cVar7 == '2') {
          ptr = ptr + -1;
          do {
            pRVar4 = (this->extension_).super_RepeatedPtrFieldBase.rep_;
            if (pRVar4 == (Rep *)0x0) {
LAB_002f699e:
              internal::RepeatedPtrFieldBase::Reserve
                        (&(this->extension_).super_RepeatedPtrFieldBase,
                         (this->extension_).super_RepeatedPtrFieldBase.total_size_ + 1);
LAB_002f69b1:
              pRVar4 = (this->extension_).super_RepeatedPtrFieldBase.rep_;
              pRVar4->allocated_size = pRVar4->allocated_size + 1;
              pFVar5 = Arena::CreateMaybeMessage<google::protobuf::FieldDescriptorProto>
                                 ((this->extension_).super_RepeatedPtrFieldBase.arena_);
              pRVar4 = (this->extension_).super_RepeatedPtrFieldBase.rep_;
              iVar3 = (this->extension_).super_RepeatedPtrFieldBase.current_size_;
              (this->extension_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
              pRVar4->elements[iVar3] = pFVar5;
            }
            else {
              iVar3 = (this->extension_).super_RepeatedPtrFieldBase.current_size_;
              if (pRVar4->allocated_size <= iVar3) {
                if (pRVar4->allocated_size ==
                    (this->extension_).super_RepeatedPtrFieldBase.total_size_) goto LAB_002f699e;
                goto LAB_002f69b1;
              }
              (this->extension_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
              pFVar5 = (FieldDescriptorProto *)pRVar4->elements[iVar3];
            }
            ptr = internal::ParseContext::ParseMessage<google::protobuf::FieldDescriptorProto>
                            (ctx,pFVar5,ptr + 1);
            if (ptr == (char *)0x0) goto LAB_002f6ba4;
            cVar7 = '\x02';
          } while ((ptr < (ctx->super_EpsCopyInputStream).limit_end_) && (*ptr == '2'));
          goto LAB_002f6b99;
        }
        break;
      case 7:
        if (cVar7 == ':') {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
          if (this->options_ == (MessageOptions *)0x0) {
            pAVar8 = (Arena *)(this->_internal_metadata_).
                              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                              .ptr_;
            if (((ulong)pAVar8 & 1) != 0) {
              pAVar8 = *(Arena **)(((ulong)pAVar8 & 0xfffffffffffffffe) + 0x18);
            }
            pMVar6 = Arena::CreateMaybeMessage<google::protobuf::MessageOptions>(pAVar8);
            this->options_ = pMVar6;
          }
          ptr = internal::ParseContext::ParseMessage<google::protobuf::MessageOptions>
                          (ctx,this->options_,ptr);
          goto LAB_002f6b87;
        }
        break;
      case 8:
        if (cVar7 == 'B') {
          ptr = ptr + -1;
          do {
            pRVar4 = (this->oneof_decl_).super_RepeatedPtrFieldBase.rep_;
            if (pRVar4 == (Rep *)0x0) {
LAB_002f682c:
              internal::RepeatedPtrFieldBase::Reserve
                        (&(this->oneof_decl_).super_RepeatedPtrFieldBase,
                         (this->oneof_decl_).super_RepeatedPtrFieldBase.total_size_ + 1);
LAB_002f683f:
              pRVar4 = (this->oneof_decl_).super_RepeatedPtrFieldBase.rep_;
              pRVar4->allocated_size = pRVar4->allocated_size + 1;
              msg_02 = Arena::CreateMaybeMessage<google::protobuf::OneofDescriptorProto>
                                 ((this->oneof_decl_).super_RepeatedPtrFieldBase.arena_);
              pRVar4 = (this->oneof_decl_).super_RepeatedPtrFieldBase.rep_;
              iVar3 = (this->oneof_decl_).super_RepeatedPtrFieldBase.current_size_;
              (this->oneof_decl_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
              pRVar4->elements[iVar3] = msg_02;
            }
            else {
              iVar3 = (this->oneof_decl_).super_RepeatedPtrFieldBase.current_size_;
              if (pRVar4->allocated_size <= iVar3) {
                if (pRVar4->allocated_size ==
                    (this->oneof_decl_).super_RepeatedPtrFieldBase.total_size_) goto LAB_002f682c;
                goto LAB_002f683f;
              }
              (this->oneof_decl_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
              msg_02 = (OneofDescriptorProto *)pRVar4->elements[iVar3];
            }
            ptr = internal::ParseContext::ParseMessage<google::protobuf::OneofDescriptorProto>
                            (ctx,msg_02,ptr + 1);
            if (ptr == (char *)0x0) goto LAB_002f6ba4;
            cVar7 = '\x02';
          } while ((ptr < (ctx->super_EpsCopyInputStream).limit_end_) && (*ptr == 'B'));
          goto LAB_002f6b99;
        }
        break;
      case 9:
        if (cVar7 == 'J') {
          ptr = ptr + -1;
          do {
            pRVar4 = (this->reserved_range_).super_RepeatedPtrFieldBase.rep_;
            if (pRVar4 == (Rep *)0x0) {
LAB_002f6ab0:
              internal::RepeatedPtrFieldBase::Reserve
                        (&(this->reserved_range_).super_RepeatedPtrFieldBase,
                         (this->reserved_range_).super_RepeatedPtrFieldBase.total_size_ + 1);
LAB_002f6ac3:
              pRVar4 = (this->reserved_range_).super_RepeatedPtrFieldBase.rep_;
              pRVar4->allocated_size = pRVar4->allocated_size + 1;
              msg_03 = Arena::CreateMaybeMessage<google::protobuf::DescriptorProto_ReservedRange>
                                 ((this->reserved_range_).super_RepeatedPtrFieldBase.arena_);
              pRVar4 = (this->reserved_range_).super_RepeatedPtrFieldBase.rep_;
              iVar3 = (this->reserved_range_).super_RepeatedPtrFieldBase.current_size_;
              (this->reserved_range_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
              pRVar4->elements[iVar3] = msg_03;
            }
            else {
              iVar3 = (this->reserved_range_).super_RepeatedPtrFieldBase.current_size_;
              if (pRVar4->allocated_size <= iVar3) {
                if (pRVar4->allocated_size ==
                    (this->reserved_range_).super_RepeatedPtrFieldBase.total_size_)
                goto LAB_002f6ab0;
                goto LAB_002f6ac3;
              }
              (this->reserved_range_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
              msg_03 = (DescriptorProto_ReservedRange *)pRVar4->elements[iVar3];
            }
            ptr = internal::ParseContext::
                  ParseMessage<google::protobuf::DescriptorProto_ReservedRange>(ctx,msg_03,ptr + 1);
            if (ptr == (char *)0x0) goto LAB_002f6ba4;
            cVar7 = '\x02';
          } while ((ptr < (ctx->super_EpsCopyInputStream).limit_end_) && (*ptr == 'J'));
          goto LAB_002f6b99;
        }
        break;
      case 10:
        if (cVar7 == 'R') {
          ptr = ptr + -1;
          do {
            pRVar4 = (this->reserved_name_).super_RepeatedPtrFieldBase.rep_;
            if (pRVar4 == (Rep *)0x0) {
LAB_002f65eb:
              internal::RepeatedPtrFieldBase::Reserve
                        (&(this->reserved_name_).super_RepeatedPtrFieldBase,
                         (this->reserved_name_).super_RepeatedPtrFieldBase.total_size_ + 1);
LAB_002f65fc:
              pRVar4 = (this->reserved_name_).super_RepeatedPtrFieldBase.rep_;
              pRVar4->allocated_size = pRVar4->allocated_size + 1;
              pAVar8 = (this->reserved_name_).super_RepeatedPtrFieldBase.arena_;
              if (pAVar8 == (Arena *)0x0) {
                s = (string *)operator_new(0x20);
              }
              else {
                if (pAVar8->hooks_cookie_ != (void *)0x0) {
                  Arena::OnArenaAllocation(pAVar8,(type_info *)&std::__cxx11::string::typeinfo,0x20)
                  ;
                }
                s = (string *)
                    internal::ArenaImpl::AllocateAlignedAndAddCleanup
                              (&pAVar8->impl_,0x20,
                               internal::arena_destruct_object<std::__cxx11::string>);
              }
              (s->_M_dataplus)._M_p = (pointer)&s->field_2;
              s->_M_string_length = 0;
              (s->field_2)._M_local_buf[0] = '\0';
              pRVar4 = (this->reserved_name_).super_RepeatedPtrFieldBase.rep_;
              iVar3 = (this->reserved_name_).super_RepeatedPtrFieldBase.current_size_;
              (this->reserved_name_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
              pRVar4->elements[iVar3] = s;
            }
            else {
              iVar3 = (this->reserved_name_).super_RepeatedPtrFieldBase.current_size_;
              if (pRVar4->allocated_size <= iVar3) {
                if (pRVar4->allocated_size ==
                    (this->reserved_name_).super_RepeatedPtrFieldBase.total_size_)
                goto LAB_002f65eb;
                goto LAB_002f65fc;
              }
              (this->reserved_name_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
              s = (string *)pRVar4->elements[iVar3];
            }
            ptr = internal::InlineGreedyStringParser(s,ptr + 1,ctx);
            if (ptr == (char *)0x0) goto LAB_002f6ba4;
            cVar7 = '\x02';
          } while ((ptr < (ctx->super_EpsCopyInputStream).limit_end_) && (*ptr == 'R'));
          goto LAB_002f6b99;
        }
      }
      if (tag == 0 || (tag & 7) == 4) {
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = tag - 1;
        cVar7 = '\x17';
      }
      else {
        ptr = internal::UnknownFieldParse(tag,&this->_internal_metadata_,ptr,ctx);
LAB_002f6b87:
        cVar7 = (ptr == (char *)0x0) * '\x02' + '\x02';
      }
    }
LAB_002f6b99:
    if (cVar7 != '\x02') {
      if (cVar7 == '\x04') {
        ptr = (char *)0x0;
      }
      return ptr;
    }
  } while( true );
}

Assistant:

const char* DescriptorProto::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArenaNoVirtual(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional string name = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_name(), ptr, ctx, "google.protobuf.DescriptorProto.name");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.FieldDescriptorProto field = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_field(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<18>(ptr));
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.DescriptorProto nested_type = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 26)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_nested_type(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<26>(ptr));
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.EnumDescriptorProto enum_type = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 34)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_enum_type(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<34>(ptr));
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.DescriptorProto.ExtensionRange extension_range = 5;
      case 5:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 42)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_extension_range(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<42>(ptr));
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.FieldDescriptorProto extension = 6;
      case 6:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 50)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_extension(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<50>(ptr));
        } else goto handle_unusual;
        continue;
      // optional .google.protobuf.MessageOptions options = 7;
      case 7:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 58)) {
          ptr = ctx->ParseMessage(_internal_mutable_options(), ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.OneofDescriptorProto oneof_decl = 8;
      case 8:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 66)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_oneof_decl(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<66>(ptr));
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.DescriptorProto.ReservedRange reserved_range = 9;
      case 9:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 74)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_reserved_range(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<74>(ptr));
        } else goto handle_unusual;
        continue;
      // repeated string reserved_name = 10;
      case 10:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 82)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_add_reserved_name(), ptr, ctx, "google.protobuf.DescriptorProto.reserved_name");
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<82>(ptr));
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}